

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarModel::internalUpdate(QCalendarModel *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = (undefined1 *)0xffffffffffffffff;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = (undefined1 *)0x0;
  puStack_58 = (undefined1 *)0x0;
  (**(code **)(*(long *)this + 0x60))((QModelIndex *)&local_48,this,0,0,&local_68);
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)0xffffffffffffffff;
  local_88.ptr = (int *)0x0;
  local_88.size = 0;
  (**(code **)(*(long *)this + 0x60))
            (&local_68,this,this->m_firstRow + 5,this->m_firstColumn + 6,&local_88);
  local_88.d = (Data *)0x0;
  local_88.ptr = (int *)0x0;
  local_88.size = 0;
  QAbstractItemModel::dataChanged
            ((QModelIndex *)this,(QModelIndex *)&local_48,(QList_conflict *)&local_68);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_88);
  QAbstractItemModel::headerDataChanged((Orientation)this,2,0);
  QAbstractItemModel::headerDataChanged((Orientation)this,1,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarModel::internalUpdate()
{
    QModelIndex begin = index(0, 0);
    QModelIndex end = index(m_firstRow + RowCount - 1, m_firstColumn + ColumnCount - 1);
    emit dataChanged(begin, end);
    emit headerDataChanged(Qt::Vertical, 0, m_firstRow + RowCount - 1);
    emit headerDataChanged(Qt::Horizontal, 0, m_firstColumn + ColumnCount - 1);
}